

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint HuffmanTree_makeTable(HuffmanTree_conflict *tree)

{
  byte bVar1;
  ushort uVar2;
  uchar uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  void *dst;
  uchar *puVar7;
  unsigned_short *puVar8;
  uint local_90;
  uint index2;
  uint reverse2;
  uint j_1;
  uint num_1;
  uint start;
  uint tablelen;
  uint maxlen;
  uint index_2;
  uint index_1;
  uint j;
  uint num;
  uint reverse;
  uint symbol_1;
  uint l_3;
  uint l_2;
  uint l_1;
  uint index;
  uint l;
  uint symbol;
  uint *maxlens;
  size_t size;
  size_t pointer;
  size_t numpresent;
  size_t i;
  HuffmanTree_conflict *tree_local;
  
  dst = lodepng_malloc(0x800);
  if (dst == (void *)0x0) {
    tree_local._4_4_ = 0x53;
  }
  else {
    lodepng_memset(dst,0,0x800);
    for (numpresent = 0; numpresent < tree->numcodes; numpresent = numpresent + 1) {
      local_90 = tree->lengths[numpresent];
      if (9 < local_90) {
        uVar5 = reverseBits(tree->codes[numpresent] >> ((char)local_90 - 9U & 0x1f),9);
        if (local_90 < *(uint *)((long)dst + (ulong)uVar5 * 4)) {
          local_90 = *(uint *)((long)dst + (ulong)uVar5 * 4);
        }
        *(uint *)((long)dst + (ulong)uVar5 * 4) = local_90;
      }
    }
    maxlens = (uint *)0x200;
    for (numpresent = 0; numpresent < 0x200; numpresent = numpresent + 1) {
      uVar5 = *(uint *)((long)dst + numpresent * 4);
      if (9 < uVar5) {
        maxlens = (uint *)((ulong)(uint)(1 << ((char)uVar5 - 9U & 0x1f)) + (long)maxlens);
      }
    }
    puVar7 = (uchar *)lodepng_malloc((size_t)maxlens);
    tree->table_len = puVar7;
    puVar8 = (unsigned_short *)lodepng_malloc((long)maxlens << 1);
    tree->table_value = puVar8;
    if ((tree->table_len == (uchar *)0x0) || (tree->table_value == (unsigned_short *)0x0)) {
      lodepng_free(dst);
      tree_local._4_4_ = 0x53;
    }
    else {
      for (numpresent = 0; numpresent < maxlens; numpresent = numpresent + 1) {
        tree->table_len[numpresent] = '\x10';
      }
      size = 0x200;
      for (numpresent = 0; numpresent < 0x200; numpresent = numpresent + 1) {
        uVar5 = *(uint *)((long)dst + numpresent * 4);
        if (9 < uVar5) {
          uVar3 = (uchar)uVar5;
          tree->table_len[numpresent] = uVar3;
          tree->table_value[numpresent] = (unsigned_short)size;
          size = (uint)(1 << (uVar3 - 9 & 0x1f)) + size;
        }
      }
      lodepng_free(dst);
      pointer = 0;
      for (numpresent = 0; numpresent < tree->numcodes; numpresent = numpresent + 1) {
        uVar5 = tree->lengths[numpresent];
        if (uVar5 != 0) {
          uVar6 = reverseBits(tree->codes[numpresent],uVar5);
          pointer = pointer + 1;
          bVar4 = (byte)uVar5;
          if (uVar5 < 10) {
            for (index_2 = 0; index_2 < (uint)(1 << (9 - bVar4 & 0x1f)); index_2 = index_2 + 1) {
              uVar5 = uVar6 | index_2 << (bVar4 & 0x1f);
              if (tree->table_len[uVar5] != '\x10') {
                return 0x37;
              }
              tree->table_len[uVar5] = bVar4;
              tree->table_value[uVar5] = (unsigned_short)numpresent;
            }
          }
          else {
            bVar1 = tree->table_len[uVar6 & 0x1ff];
            uVar2 = tree->table_value[uVar6 & 0x1ff];
            if (bVar1 < uVar5) {
              return 0x37;
            }
            for (index2 = 0; index2 < (uint)(1 << ((bVar1 - 9) - (bVar4 - 9) & 0x1f));
                index2 = index2 + 1) {
              uVar5 = (uint)uVar2 + (uVar6 >> 9 | index2 << (bVar4 - 9 & 0x1f));
              tree->table_len[uVar5] = bVar4;
              tree->table_value[uVar5] = (unsigned_short)numpresent;
            }
          }
        }
      }
      if (pointer < 2) {
        for (numpresent = 0; numpresent < maxlens; numpresent = numpresent + 1) {
          if (tree->table_len[numpresent] == '\x10') {
            uVar3 = '\n';
            if (numpresent < 0x200) {
              uVar3 = '\x01';
            }
            tree->table_len[numpresent] = uVar3;
            tree->table_value[numpresent] = 0xffff;
          }
        }
      }
      else {
        for (numpresent = 0; numpresent < maxlens; numpresent = numpresent + 1) {
          if (tree->table_len[numpresent] == '\x10') {
            return 0x37;
          }
        }
      }
      tree_local._4_4_ = 0;
    }
  }
  return tree_local._4_4_;
}

Assistant:

static unsigned HuffmanTree_makeTable(HuffmanTree* tree) {
  static const unsigned headsize = 1u << FIRSTBITS; /*size of the first table*/
  static const unsigned mask = (1u << FIRSTBITS) /*headsize*/ - 1u;
  size_t i, numpresent, pointer, size; /*total table size*/
  unsigned* maxlens = (unsigned*)lodepng_malloc(headsize * sizeof(unsigned));
  if(!maxlens) return 83; /*alloc fail*/

  /* compute maxlens: max total bit length of symbols sharing prefix in the first table*/
  lodepng_memset(maxlens, 0, headsize * sizeof(*maxlens));
  for(i = 0; i < tree->numcodes; i++) {
    unsigned symbol = tree->codes[i];
    unsigned l = tree->lengths[i];
    unsigned index;
    if(l <= FIRSTBITS) continue; /*symbols that fit in first table don't increase secondary table size*/
    /*get the FIRSTBITS MSBs, the MSBs of the symbol are encoded first. See later comment about the reversing*/
    index = reverseBits(symbol >> (l - FIRSTBITS), FIRSTBITS);
    maxlens[index] = LODEPNG_MAX(maxlens[index], l);
  }
  /* compute total table size: size of first table plus all secondary tables for symbols longer than FIRSTBITS */
  size = headsize;
  for(i = 0; i < headsize; ++i) {
    unsigned l = maxlens[i];
    if(l > FIRSTBITS) size += (1u << (l - FIRSTBITS));
  }
  tree->table_len = (unsigned char*)lodepng_malloc(size * sizeof(*tree->table_len));
  tree->table_value = (unsigned short*)lodepng_malloc(size * sizeof(*tree->table_value));
  if(!tree->table_len || !tree->table_value) {
    lodepng_free(maxlens);
    /* freeing tree->table values is done at a higher scope */
    return 83; /*alloc fail*/
  }
  /*initialize with an invalid length to indicate unused entries*/
  for(i = 0; i < size; ++i) tree->table_len[i] = 16;

  /*fill in the first table for long symbols: max prefix size and pointer to secondary tables*/
  pointer = headsize;
  for(i = 0; i < headsize; ++i) {
    unsigned l = maxlens[i];
    if(l <= FIRSTBITS) continue;
    tree->table_len[i] = l;
    tree->table_value[i] = pointer;
    pointer += (1u << (l - FIRSTBITS));
  }
  lodepng_free(maxlens);

  /*fill in the first table for short symbols, or secondary table for long symbols*/
  numpresent = 0;
  for(i = 0; i < tree->numcodes; ++i) {
    unsigned l = tree->lengths[i];
    unsigned symbol, reverse;
    if(l == 0) continue;
    symbol = tree->codes[i]; /*the huffman bit pattern. i itself is the value.*/
    /*reverse bits, because the huffman bits are given in MSB first order but the bit reader reads LSB first*/
    reverse = reverseBits(symbol, l);
    numpresent++;

    if(l <= FIRSTBITS) {
      /*short symbol, fully in first table, replicated num times if l < FIRSTBITS*/
      unsigned num = 1u << (FIRSTBITS - l);
      unsigned j;
      for(j = 0; j < num; ++j) {
        /*bit reader will read the l bits of symbol first, the remaining FIRSTBITS - l bits go to the MSB's*/
        unsigned index = reverse | (j << l);
        if(tree->table_len[index] != 16) return 55; /*invalid tree: long symbol shares prefix with short symbol*/
        tree->table_len[index] = l;
        tree->table_value[index] = i;
      }
    } else {
      /*long symbol, shares prefix with other long symbols in first lookup table, needs second lookup*/
      /*the FIRSTBITS MSBs of the symbol are the first table index*/
      unsigned index = reverse & mask;
      unsigned maxlen = tree->table_len[index];
      /*log2 of secondary table length, should be >= l - FIRSTBITS*/
      unsigned tablelen = maxlen - FIRSTBITS;
      unsigned start = tree->table_value[index]; /*starting index in secondary table*/
      unsigned num = 1u << (tablelen - (l - FIRSTBITS)); /*amount of entries of this symbol in secondary table*/
      unsigned j;
      if(maxlen < l) return 55; /*invalid tree: long symbol shares prefix with short symbol*/
      for(j = 0; j < num; ++j) {
        unsigned reverse2 = reverse >> FIRSTBITS; /* l - FIRSTBITS bits */
        unsigned index2 = start + (reverse2 | (j << (l - FIRSTBITS)));
        tree->table_len[index2] = l;
        tree->table_value[index2] = i;
      }
    }
  }

  if(numpresent < 2) {
    /* In case of exactly 1 symbol, in theory the huffman symbol needs 0 bits,
    but deflate uses 1 bit instead. In case of 0 symbols, no symbols can
    appear at all, but such huffman tree could still exist (e.g. if distance
    codes are never used). In both cases, not all symbols of the table will be
    filled in. Fill them in with an invalid symbol value so returning them from
    huffmanDecodeSymbol will cause error. */
    for(i = 0; i < size; ++i) {
      if(tree->table_len[i] == 16) {
        /* As length, use a value smaller than FIRSTBITS for the head table,
        and a value larger than FIRSTBITS for the secondary table, to ensure
        valid behavior for advanceBits when reading this symbol. */
        tree->table_len[i] = (i < headsize) ? 1 : (FIRSTBITS + 1);
        tree->table_value[i] = INVALIDSYMBOL;
      }
    }
  } else {
    /* A good huffman tree has N * 2 - 1 nodes, of which N - 1 are internal nodes.
    If that is not the case (due to too long length codes), the table will not
    have been fully used, and this is an error (not all bit combinations can be
    decoded): an oversubscribed huffman tree, indicated by error 55. */
    for(i = 0; i < size; ++i) {
      if(tree->table_len[i] == 16) return 55;
    }
  }

  return 0;
}